

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveObjectsWriter.cpp
# Opt level: O2

void __thiscall
PrimitiveObjectsWriter::WriteLiteralString
          (PrimitiveObjectsWriter *this,string *inString,ETokenSeparator inSeparate)

{
  byte bVar1;
  IByteWriter *pIVar2;
  byte *pbVar3;
  byte *pbVar4;
  undefined8 uStack_50;
  Byte buffer [5];
  
  pIVar2 = this->mStreamForWriting;
  if (pIVar2 != (IByteWriter *)0x0) {
    (*pIVar2->_vptr_IByteWriter[2])(pIVar2,"(",1);
    pbVar3 = (byte *)(inString->_M_dataplus)._M_p;
    for (pbVar4 = pbVar3; pbVar4 != pbVar3 + inString->_M_string_length; pbVar4 = pbVar4 + 1) {
      bVar1 = *pbVar4;
      if ((bVar1 - 0x28 < 0x35) && ((0x10000000000003U >> ((ulong)(bVar1 - 0x28) & 0x3f) & 1) != 0))
      {
        buffer[0] = '\\';
        uStack_50 = 2;
        buffer[1] = bVar1;
      }
      else if ((byte)(bVar1 + 0x81) < 0xa1) {
        sprintf((char *)buffer,"\\%03o");
        uStack_50 = 4;
      }
      else {
        uStack_50 = 1;
        buffer[0] = bVar1;
      }
      (*this->mStreamForWriting->_vptr_IByteWriter[2])(this->mStreamForWriting,buffer,uStack_50);
      pbVar3 = (byte *)(inString->_M_dataplus)._M_p;
    }
    (*this->mStreamForWriting->_vptr_IByteWriter[2])(this->mStreamForWriting,")",1);
    WriteTokenSeparator(this,inSeparate);
  }
  return;
}

Assistant:

void PrimitiveObjectsWriter::WriteLiteralString(const std::string& inString,ETokenSeparator inSeparate)
{
	if(!mStreamForWriting)
		return;
	mStreamForWriting->Write(scLeftParanthesis,1);
	// doing some string conversion, so that charachters are written as safe ones.
	IOBasicTypes::Byte buffer[5];
	std::string::const_iterator it = inString.begin();
	for(;it != inString.end();++it)
	{
		Byte aValue = *it;
		if(aValue == '(' || aValue == ')' || aValue == '\\')
		{
			buffer[0] = '\\';
			buffer[1] = aValue;
			mStreamForWriting->Write(buffer,2);
		}
		else if (aValue < 32 || aValue > 126) // grabbing all nonprintable chars
		{
			SAFE_SPRINTF_1((char*)buffer,5,"\\%03o",aValue); 
			mStreamForWriting->Write(buffer,4);		
		}
		else
		{
			buffer[0] = aValue;
			mStreamForWriting->Write(buffer,1);
		}
		
	}
	mStreamForWriting->Write(scRightParanthesis,1);
	WriteTokenSeparator(inSeparate);
}